

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

error_t parse_opt(int key,char *arg,argp_state *state)

{
  error_t eVar1;
  
  eVar1 = 7;
  if (key == 99) {
    *(char **)state->input = arg;
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

static error_t
parse_opt (int key, char *arg, struct argp_state *state)
{
    struct arg_data *data = (struct arg_data *)state->input;
    switch (key)
    {
    case 'c':
        data->config_file = arg;
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}